

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O0

dtl_error_t dtl_json_writer_write_hv(dtl_json_writer_t *self,dtl_hv_t *hv,_Bool indentEnable)

{
  dtl_error_t dVar1;
  dtl_sv_t *pdVar2;
  char *str;
  dtl_dv_t *dv;
  char *key_1;
  dtl_dv_t *value_1;
  char *pcStack_68;
  _Bool ok_1;
  char *separatorString_1;
  char *key;
  dtl_dv_t *value;
  char *pcStack_48;
  _Bool ok;
  char *separatorString;
  dtl_av_t *pdStack_38;
  dtl_error_t errorCode;
  dtl_av_t *keys;
  int local_28;
  int32_t numKeys;
  int32_t i;
  _Bool indentEnable_local;
  dtl_hv_t *hv_local;
  dtl_json_writer_t *self_local;
  
  numKeys._3_1_ = indentEnable;
  _i = hv;
  hv_local = (dtl_hv_t *)self;
  pdStack_38 = dtl_hv_keys(hv);
  if (pdStack_38 == (dtl_av_t *)0x0) {
    self_local._4_4_ = 2;
  }
  else {
    if (((ulong)hv_local[3].pAny & 1) != 0) {
      dVar1 = dtl_av_sort(pdStack_38,(dtl_key_func_t *)0x0,false);
      if (dVar1 != 0) {
        return dVar1;
      }
      separatorString._4_4_ = 0;
    }
    keys._4_4_ = dtl_av_length(pdStack_38);
    if ((numKeys._3_1_ & 1) == 0) {
      dtl_json_writer_putc((dtl_json_writer_t *)hv_local,'{');
    }
    else {
      dtl_json_writer_indented_cstr((dtl_json_writer_t *)hv_local,"{");
    }
    if (0 < keys._4_4_) {
      dtl_json_writer_increaseIndent((dtl_json_writer_t *)hv_local);
      if (hv_local->u32RefCnt == 0) {
        pcStack_48 = ", ";
        for (local_28 = 0; local_28 < keys._4_4_; local_28 = local_28 + 1) {
          value._7_1_ = 0;
          pdVar2 = (dtl_sv_t *)dtl_av_value(pdStack_38,local_28);
          separatorString_1 = dtl_sv_to_cstr(pdVar2,(_Bool *)((long)&value + 7));
          if ((value._7_1_ & 1) != 0) {
            if (0 < local_28) {
              dtl_json_writer_print((dtl_json_writer_t *)hv_local,pcStack_48);
            }
            dtl_json_writer_putc((dtl_json_writer_t *)hv_local,'\"');
            dtl_json_writer_print((dtl_json_writer_t *)hv_local,separatorString_1);
            dtl_json_writer_print((dtl_json_writer_t *)hv_local,"\": ");
            key = (char *)dtl_hv_get_cstr(_i,separatorString_1);
            dtl_json_writer_write_dv((dtl_json_writer_t *)hv_local,(dtl_dv_t *)key,true);
          }
        }
      }
      else {
        pcStack_68 = ",";
        dtl_json_writer_print((dtl_json_writer_t *)hv_local,*(char **)&hv_local[2].u32RefCnt);
        for (local_28 = 0; local_28 < keys._4_4_; local_28 = local_28 + 1) {
          value_1._7_1_ = 0;
          pdVar2 = (dtl_sv_t *)dtl_av_value(pdStack_38,local_28);
          str = dtl_sv_to_cstr(pdVar2,(_Bool *)((long)&value_1 + 7));
          if ((value_1._7_1_ & 1) != 0) {
            dtl_json_writer_write_indent_str((dtl_json_writer_t *)hv_local);
            dtl_json_writer_putc((dtl_json_writer_t *)hv_local,'\"');
            dtl_json_writer_print((dtl_json_writer_t *)hv_local,str);
            dtl_json_writer_print((dtl_json_writer_t *)hv_local,"\": ");
            dv = dtl_hv_get_cstr(_i,str);
            dtl_json_writer_write_dv((dtl_json_writer_t *)hv_local,dv,false);
            if (local_28 < keys._4_4_ + -1) {
              dtl_json_writer_print((dtl_json_writer_t *)hv_local,pcStack_68);
            }
            dtl_json_writer_print((dtl_json_writer_t *)hv_local,*(char **)&hv_local[2].u32RefCnt);
          }
        }
      }
      dtl_json_writer_decreaseIndent((dtl_json_writer_t *)hv_local);
    }
    dtl_json_writer_indented_cstr((dtl_json_writer_t *)hv_local,"}");
    dtl_dv_dec_ref((dtl_dv_t *)pdStack_38);
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static dtl_error_t dtl_json_writer_write_hv(dtl_json_writer_t *self, const dtl_hv_t *hv, bool indentEnable)
{
   int32_t i;
   int32_t numKeys;
   dtl_av_t* keys;
   keys = dtl_hv_keys(hv);
   if (keys == 0)
   {
      return DTL_MEM_ERROR;
   }
   if (self->sortKeys)
   {
      dtl_error_t errorCode = dtl_av_sort(keys, (dtl_key_func_t*) 0, false);
      if (errorCode)
      {
         return errorCode;
      }
   }
   numKeys = dtl_av_length(keys);
   if (indentEnable)
   {
      dtl_json_writer_indented_cstr(self,  "{");
   }
   else
   {
      dtl_json_writer_putc(self, '{');
   }
   if (numKeys > 0)
   {
      dtl_json_writer_increaseIndent(self);
      if (self->currentIndent == 0)
      {
         const char *separatorString = ", ";

         for (i = 0; i<numKeys; i++)
         {
            bool ok = false;
            dtl_dv_t *value;
            const char *key = (const char*) dtl_sv_to_cstr((dtl_sv_t*) dtl_av_value(keys, i), &ok);
            if (ok)
            {
               if (i > 0)
               {
                  dtl_json_writer_print(self, separatorString);
               }
               dtl_json_writer_putc(self, '"');
               dtl_json_writer_print(self, key);
               dtl_json_writer_print(self, "\": ");
               value = (dtl_dv_t*)dtl_hv_get_cstr(hv, key);
               dtl_json_writer_write_dv(self, value, true);
            }
         }
      }
      else
      {
         const char *separatorString = ",";
         dtl_json_writer_print(self, self->newLineStr);
         for (i = 0; i<numKeys; i++)
         {
            bool ok = false;
            dtl_dv_t *value;
            const char *key = (const char*) dtl_sv_to_cstr((dtl_sv_t*) dtl_av_value(keys, i), &ok);
            if (ok)
            {
               dtl_json_writer_write_indent_str(self);
               dtl_json_writer_putc(self, '"');
               dtl_json_writer_print(self, key);
               dtl_json_writer_print(self, "\": ");
               value = (dtl_dv_t*)dtl_hv_get_cstr(hv, key);
               dtl_json_writer_write_dv(self, value, false);
               if (i < (numKeys - 1))
               {
                  dtl_json_writer_print(self, separatorString);
               }
               dtl_json_writer_print(self, self->newLineStr);
            }
            else
            {
               //TODO: error handling
            }
         }
      }
      dtl_json_writer_decreaseIndent(self);
   }
   dtl_json_writer_indented_cstr(self,  "}");
   dtl_dec_ref(keys);
   return DTL_NO_ERROR;
}